

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ssl_debug_helpers_generated.c
# Opt level: O1

char * mbedtls_tls_prf_types_str(mbedtls_tls_prf_types in)

{
  char *pcVar1;
  
  if (in < (MBEDTLS_SSL_HKDF_EXPAND_SHA256|MBEDTLS_SSL_TLS_PRF_SHA384)) {
    pcVar1 = &DAT_0024282c + *(int *)(&DAT_0024282c + (ulong)in * 4);
  }
  else {
    pcVar1 = "UNKNOWN_VALUE";
  }
  return pcVar1;
}

Assistant:

const char *mbedtls_tls_prf_types_str( mbedtls_tls_prf_types in )
{
    switch (in) {
        case MBEDTLS_SSL_TLS_PRF_NONE:
            return "MBEDTLS_SSL_TLS_PRF_NONE";
        case MBEDTLS_SSL_TLS_PRF_SHA384:
            return "MBEDTLS_SSL_TLS_PRF_SHA384";
        case MBEDTLS_SSL_TLS_PRF_SHA256:
            return "MBEDTLS_SSL_TLS_PRF_SHA256";
        case MBEDTLS_SSL_HKDF_EXPAND_SHA384:
            return "MBEDTLS_SSL_HKDF_EXPAND_SHA384";
        case MBEDTLS_SSL_HKDF_EXPAND_SHA256:
            return "MBEDTLS_SSL_HKDF_EXPAND_SHA256";
        default:
            return "UNKNOWN_VALUE";
    }
}